

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O3

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  cmMakefile *this_00;
  string *psVar8;
  cmUVProcessChainBuilder *this_01;
  Status *pSVar9;
  uv_loop_t *loop;
  istream *piVar10;
  long lVar11;
  long *plVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmUVProcessChain process;
  string ldConfigPath;
  string line;
  cmList ldConfigCommand;
  cmUVProcessChainBuilder builder;
  RegularExpressionMatch match;
  cmUVPipeIStream output;
  undefined1 auStack_4c8 [16];
  StdioConfiguration local_4b8;
  pointer local_4b0;
  pointer local_4a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  char *local_478;
  uv_loop_t *local_470;
  char local_468;
  undefined7 uStack_467;
  cmList local_458;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_440;
  cmUVProcessChainBuilder local_438;
  undefined1 local_3d8 [32];
  char *local_3b8 [2];
  char local_3a8 [16];
  long *local_398 [2];
  long local_388 [23];
  char *local_2d0;
  undefined1 local_1d0 [16];
  cmBasicUVStreambuf<char,_std::char_traits<char>_> local_1c0;
  uv_handle_ptr_base_<uv_pipe_s> local_148;
  undefined8 local_138 [33];
  
  local_440 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths;
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  pcVar1 = local_3d8 + 0x10;
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"CMAKE_LDCONFIG_COMMAND","");
  psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)local_3d8);
  local_4b8 = (StdioConfiguration)((long)auStack_4c8 + 0x20);
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(auStack_4c8 + 0x10),pcVar2,pcVar2 + psVar8->_M_string_length);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (local_4b0 == (pointer)0x0) {
    local_3d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"/sbin","");
    local_3b8[0] = local_3a8;
    auStack_4c8._8_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"/usr/sbin","");
    plVar12 = local_388;
    local_398[0] = plVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"/usr/local/sbin","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_3d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_438,__l,(allocator_type *)(auStack_4c8 + 0x50));
    cmsys::SystemTools::FindProgram
              ((string *)local_1d0,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_438,false);
    std::__cxx11::string::operator=((string *)(auStack_4c8 + 0x10),(string *)local_1d0);
    if ((cmBasicUVStreambuf<char,_std::char_traits<char>_> *)local_1d0._0_8_ != &local_1c0) {
      operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_438);
    lVar11 = -0x60;
    do {
      if (plVar12 != (long *)plVar12[-2]) {
        operator_delete((long *)plVar12[-2],*plVar12 + 1);
      }
      plVar12 = plVar12 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    this = (cmLDConfigLDConfigTool *)auStack_4c8._8_8_;
    if (local_4b0 == (pointer)0x0) {
      pcVar3 = *(cmRuntimeDependencyArchive **)(auStack_4c8._8_8_ + 8);
      local_3d8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Could not find ldconfig","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
      if ((pointer)local_3d8._0_8_ != pcVar1) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      bVar5 = false;
      goto LAB_005e2bfb;
    }
  }
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3d8,local_4b8,
             (undefined1 *)
             ((long)&(local_4b0->Arguments).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)local_4b8));
  init._M_len = 1;
  init._M_array = (iterator)local_3d8;
  cmList::cmList(&local_458,init);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_458,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_458,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_458,
             (char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_438);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&local_438,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_458.Values);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)auStack_4c8);
  bVar5 = cmUVProcessChain::Valid((cmUVProcessChain *)auStack_4c8);
  if ((bVar5) &&
     (pSVar9 = cmUVProcessChain::GetStatus((cmUVProcessChain *)auStack_4c8,0),
     pSVar9->SpawnResult == 0)) {
    local_478 = &local_468;
    local_470 = (uv_loop_t *)0x0;
    local_468 = '\0';
    if ((GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
         regex == '\0') &&
       (iVar7 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex), iVar7 != 0)) {
      GetLDConfigPaths::regex.regmust = (char *)0x0;
      GetLDConfigPaths::regex.program = (char *)0x0;
      GetLDConfigPaths::regex.progsize = 0;
      memset(&GetLDConfigPaths::regex,0,0x20a);
      cmsys::RegularExpression::compile(&GetLDConfigPaths::regex,"^([^\t:]*):");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                   &__dso_handle);
      __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::regex);
    }
    auStack_4c8._8_8_ = this;
    loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)auStack_4c8);
    iVar7 = cmUVProcessChain::OutputStream((cmUVProcessChain *)auStack_4c8);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
              ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)local_1d0,loop,iVar7);
    pcVar1 = auStack_4c8 + 0x40;
    while( true ) {
      cVar6 = std::ios::widen((char)*(pointer *)(local_1d0._0_8_ + -0x18) +
                              (char)(istream *)local_1d0);
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_1d0,(string *)(auStack_4c8 + 0x50),cVar6);
      if (((&piVar10->field_0x20)[(long)piVar10->_vptr_basic_istream[-3]] & 5) != 0) break;
      memset((RegularExpressionMatch *)local_3d8,0,0x208);
      bVar5 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,local_478,(RegularExpressionMatch *)local_3d8);
      if (bVar5) {
        local_498._M_dataplus._M_p = pcVar1;
        if ((char *)local_3d8._8_8_ == (char *)0x0) {
          local_498._M_string_length = 0;
          local_498.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(auStack_4c8 + 0x30),local_3d8._8_8_,local_2d0);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_440,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_4c8 + 0x30));
        if (local_498._M_dataplus._M_p != pcVar1) {
          operator_delete(local_498._M_dataplus._M_p,
                          CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                   local_498.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    bVar5 = cmUVProcessChain::Wait((cmUVProcessChain *)auStack_4c8,0);
    uVar4 = auStack_4c8._8_8_;
    pcVar1 = local_3d8 + 0x10;
    if (bVar5) {
      pSVar9 = cmUVProcessChain::GetStatus((cmUVProcessChain *)auStack_4c8,0);
      if (pSVar9->ExitStatus != 0) {
        pcVar3 = *(cmRuntimeDependencyArchive **)(uVar4 + 8);
        local_3d8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3d8,"Failed to run ldconfig","");
        cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
        goto LAB_005e2e4a;
      }
      bVar5 = true;
    }
    else {
      pcVar3 = *(cmRuntimeDependencyArchive **)(auStack_4c8._8_8_ + 8);
      local_3d8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3d8,"Failed to wait on ldconfig process","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
LAB_005e2e4a:
      if ((pointer)local_3d8._0_8_ != pcVar1) {
        operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
      }
      bVar5 = false;
    }
    local_1d0._0_8_ = cmBasicUVPipeIStream<char,std::char_traits<char>>::vtable + 0x18;
    local_138[0] = 0xa92a08;
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_(&local_148);
    local_1d0._0_8_ =
         cmBasicUVIStream<char,std::char_traits<char>>-in-cmBasicUVPipeIStream<char,std::char_traits<char>>
         ::construction_vtable + 0x18;
    local_138[0] = 0xa92a88;
    cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf(&local_1c0);
    local_1d0._0_8_ =
         std::istream-in-cmBasicUVPipeIStream<char,std::char_traits<char>>::construction_vtable +
         0x18;
    local_138[0] = 0xa92af0;
    local_1d0._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_138);
    if (local_478 != &local_468) {
      operator_delete(local_478,CONCAT71(uStack_467,local_468) + 1);
    }
  }
  else {
    pcVar3 = *(cmRuntimeDependencyArchive **)((long)this + 8);
    local_3d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"Failed to start ldconfig process","");
    cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_3d8);
    if ((pointer)local_3d8._0_8_ != pcVar1) {
      operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
    }
    bVar5 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)auStack_4c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.WorkingDirectory._M_dataplus._M_p != &local_438.WorkingDirectory.field_2) {
    operator_delete(local_438.WorkingDirectory._M_dataplus._M_p,
                    local_438.WorkingDirectory.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_438.Processes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458.Values);
LAB_005e2bfb:
  if (local_4b8 != (StdioConfiguration)((long)auStack_4c8 + 0x20)) {
    operator_delete((void *)local_4b8,
                    (ulong)((long)&(local_4a8[0]->Arguments).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  return bVar5;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  cmList ldConfigCommand{ ldConfigPath };
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}